

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void throw(hd_context *ctx)

{
  hd_error_stack_slot *phVar1;
  hd_context *ctx_local;
  
  if (ctx->error->stack <= ctx->error->top) {
    phVar1 = ctx->error->top;
    phVar1->code = phVar1->code + 2;
    siglongjmp((__jmp_buf_tag *)ctx->error->top->buffer,1);
  }
  fprintf(_stderr,"uncaught exception: %s\n",ctx->error->message);
  exit(1);
}

Assistant:

HD_NORETURN static void throw(hd_context *ctx)
{
    if (ctx->error->top >= ctx->error->stack)
    {
        ctx->error->top->code += 2;
        hd_longjmp(ctx->error->top->buffer, 1);
    }
    else
    {
        fprintf(stderr, "uncaught exception: %s\n", ctx->error->message);
#ifdef USE_OUTPUT_DEBUG_STRING
        OutputDebugStringA("uncaught exception: ");
		OutputDebugStringA(ctx->error->message);
		OutputDebugStringA("\n");
#endif
        exit(EXIT_FAILURE);
    }
}